

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int bitset_container_to_uint32_array(uint32_t *out,bitset_container_t *bc,uint32_t base)

{
  uint64_t *puVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  uint64_t uVar6;
  uint32_t *puVar7;
  
  lVar5 = cpuid_Extended_Feature_Enumeration_info(7);
  iVar3 = 0;
  if (((*(uint *)(lVar5 + 4) & 0x20) == 0) || ((long)bc->cardinality < 0x2000)) {
    puVar1 = bc->words;
    lVar5 = 0;
    do {
      uVar6 = puVar1[lVar5];
      if (uVar6 != 0) {
        puVar7 = out + iVar3;
        do {
          lVar2 = 0;
          if (uVar6 != 0) {
            for (; (uVar6 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          *puVar7 = (int)lVar2 + base;
          iVar3 = iVar3 + 1;
          puVar7 = puVar7 + 1;
          uVar6 = uVar6 & uVar6 - 1;
        } while (uVar6 != 0);
      }
      base = base + 0x40;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x400);
  }
  else {
    sVar4 = bitset_extract_setbits_avx2(bc->words,0x400,out,(long)bc->cardinality,base);
    iVar3 = (int)sVar4;
  }
  return iVar3;
}

Assistant:

int bitset_container_to_uint32_array(
    uint32_t *out,
    const bitset_container_t *bc,
    uint32_t base
){
#ifdef CROARING_IS_X64
    if(( croaring_avx2() ) &&  (bc->cardinality >= 8192))  // heuristic
		return (int) bitset_extract_setbits_avx2(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, bc->cardinality, base);
	else
		return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#else
	return (int) bitset_extract_setbits(bc->words,
                BITSET_CONTAINER_SIZE_IN_WORDS, out, base);
#endif
}